

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3length.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  adu_t *__ptr;
  ulong uVar2;
  file_t mp3file;
  aq_t qin;
  char buf [256];
  mp3_frame_t frame;
  
  if (argc == 2) {
    iVar1 = file_open_read(&mp3file,argv[1]);
    if (iVar1 != 0) {
      aq_init(&qin);
      uVar2 = 0;
      while( true ) {
        do {
          iVar1 = mp3_next_frame(&mp3file,&frame);
          if (iVar1 < 1) {
            file_close(&mp3file);
            aq_destroy(&qin);
            format_time(uVar2 / 1000,buf,0x100);
            printf("Length of %s: %s\n",argv[1],buf);
            return 0;
          }
          iVar1 = aq_add_frame(&qin,&frame);
        } while (iVar1 == 0);
        __ptr = aq_get_adu(&qin);
        if (__ptr == (adu_t *)0x0) break;
        uVar2 = uVar2 + __ptr->usec;
        free(__ptr);
      }
      __assert_fail("adu != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3length.c",0x2a
                    ,"int main(int, char **)");
    }
    fprintf(_stderr,"Could not open mp3 file: %s\n",argv[1]);
  }
  else {
    fwrite("Usage: mp3length mp3file\n",0x19,1,_stderr);
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[]) {
  int retval = EXIT_SUCCESS;

  if (argc != 2) {
    usage();
    return EXIT_FAILURE;
  }

  file_t mp3file;
  if (!file_open_read(&mp3file, argv[1])) {
    fprintf(stderr, "Could not open mp3 file: %s\n", argv[1]);
    retval = EXIT_FAILURE;
    goto exit;
  }

  aq_t qin;
  aq_init(&qin);
  
  mp3_frame_t frame;
  int ret;
  unsigned long long time = 0;
  while ((ret = mp3_next_frame(&mp3file, &frame)) > 0) {
    if (aq_add_frame(&qin, &frame)) { 
      adu_t *adu = aq_get_adu(&qin);
      assert(adu != NULL);
      
      time += adu->usec;
      free(adu);
    }
  }
          
  file_close(&mp3file);
  aq_destroy(&qin);

  char buf[256];
  format_time(time / 1000, buf, sizeof(buf));
  printf("Length of %s: %s\n", argv[1], buf);

 exit:
  return retval;
}